

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mul_txx9(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 t3_3;
  TCGv_i64 t2_3;
  TCGv_i64 t3_2;
  TCGv_i64 t2_2;
  TCGv_i32 t3_1;
  TCGv_i32 t2_1;
  TCGv_i32 t3;
  TCGv_i32 t2;
  int acc;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  t2._4_4_ = 0;
  gen_load_gpr(tcg_ctx_00,t,rs);
  gen_load_gpr(tcg_ctx_00,t_00,rt);
  if (opc == 0x18) {
LAB_00d374f4:
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
    tcg_gen_muls2_i32_mips64el(tcg_ctx_00,pTVar1,pTVar2,pTVar1,pTVar2);
    if (rd != 0) {
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar1);
    }
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[t2._4_4_],pTVar1);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[t2._4_4_],pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  }
  else {
    if (opc == 0x19) {
LAB_00d375cc:
      pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
      tcg_gen_mulu2_i32_mips64el(tcg_ctx_00,pTVar1,pTVar2,pTVar1,pTVar2);
      if (rd != 0) {
        tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar1);
      }
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[t2._4_4_],pTVar1);
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[t2._4_4_],pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      goto LAB_00d378fe;
    }
    if (opc == 0x70000000) {
LAB_00d376a4:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar3,t);
      tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar4,t_00);
      tcg_gen_mul_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_concat32_i64
                (tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_LO[t2._4_4_],tcg_ctx_00->cpu_HI[t2._4_4_]);
      tcg_gen_add_i64(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_LO[t2._4_4_],pTVar3);
      gen_move_high32(tcg_ctx_00,tcg_ctx_00->cpu_HI[t2._4_4_],pTVar3);
      if (rd != 0) {
        gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar3);
      }
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      goto LAB_00d378fe;
    }
    if (opc != 0x70000001) {
      if (opc == 0x70000018) {
        t2._4_4_ = 1;
        goto LAB_00d374f4;
      }
      if (opc == 0x70000019) {
        t2._4_4_ = 1;
        goto LAB_00d375cc;
      }
      if (opc == 0x70000020) {
        t2._4_4_ = 1;
        goto LAB_00d376a4;
      }
      if (opc != 0x70000021) {
        generate_exception_end(ctx,0x14);
        goto LAB_00d378fe;
      }
      t2._4_4_ = 1;
    }
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t_00,t_00);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar3,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar4,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_concat32_i64
              (tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_LO[t2._4_4_],tcg_ctx_00->cpu_HI[t2._4_4_]);
    tcg_gen_add_i64(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_LO[t2._4_4_],pTVar3);
    gen_move_high32(tcg_ctx_00,tcg_ctx_00->cpu_HI[t2._4_4_],pTVar3);
    if (rd != 0) {
      gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar3);
    }
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
LAB_00d378fe:
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return;
}

Assistant:

static void gen_mul_txx9(DisasContext *ctx, uint32_t opc,
                         int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int acc = 0;

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case MMI_OPC_MULT1:
        acc = 1;
        /* Fall through */
    case OPC_MULT:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            if (rd) {
                tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case MMI_OPC_MULTU1:
        acc = 1;
        /* Fall through */
    case OPC_MULTU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            if (rd) {
                tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case MMI_OPC_MADD1:
        acc = 1;
        /* Fall through */
    case MMI_OPC_MADD:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            if (rd) {
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case MMI_OPC_MADDU1:
        acc = 1;
        /* Fall through */
    case MMI_OPC_MADDU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            if (rd) {
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    default:
        MIPS_INVAL("mul/madd TXx9");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}